

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O3

Utest * __thiscall
TEST_MockReturnValueTest_LongLongIntegerReturnValue_TestShell::createTest
          (TEST_MockReturnValueTest_LongLongIntegerReturnValue_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
                                  ,0x20b);
  this_00->_vptr_Utest = (_func_int **)0x0;
  Utest::Utest(this_00);
  this_00->_vptr_Utest = (_func_int **)&PTR__Utest_002c2e98;
  return this_00;
}

Assistant:

TEST(MockReturnValueTest, LongLongIntegerReturnValue)
{
    long long int expected_value = 7;
    mock().expectOneCall("foo").andReturnValue(expected_value);

    MockActualCall& actual_call = mock().actualCall("foo");
    LONGLONGS_EQUAL(expected_value, actual_call.returnValue().getLongLongIntValue());
    LONGLONGS_EQUAL(expected_value, actual_call.returnLongLongIntValue());
    LONGLONGS_EQUAL(expected_value, mock().returnValue().getLongLongIntValue());
    LONGLONGS_EQUAL(expected_value, mock().longLongIntReturnValue());
}